

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_tet2_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar8 = 0xa6;
    goto LAB_001288d7;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(4 / (long)iVar6);
  iVar12 = iVar5 * iVar6;
  if (4 < iVar12) {
    iVar9 = ((((iVar6 + 4) / iVar6) * (iVar12 + -5)) / iVar5 - iVar12) + 5;
  }
  if (iVar7 == iVar9) {
LAB_001289bc:
    uVar4 = ref_node_add(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xb7,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xb8,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xb9,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xba,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xbc,"ref_fixture_tet2_grid",(ulong)uVar4,"add tet");
      return uVar4;
    }
  }
  else {
    iVar6 = (iVar6 + 4) / iVar6;
    iVar9 = 0;
    if (iVar6 + 1U < 3) {
      iVar9 = iVar6;
    }
    iVar12 = 5 - iVar12;
    if (iVar12 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_001289bc;
    iVar9 = (int)(2 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_001289bc;
    iVar9 = (int)(3 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (3 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_001289bc;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = (iVar6 + 4) / iVar6;
  iVar12 = (int)(4 / (long)iVar9);
  iVar5 = (int)(4 / (long)iVar6);
  iVar6 = 5 - iVar5 * iVar6;
  if (iVar6 <= iVar12) {
    iVar12 = (4 - iVar6 * iVar9) / iVar5 + iVar6;
  }
  if (iVar7 == iVar12) {
LAB_00128fc3:
    uVar4 = ref_node_add(ref_node,4,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xcc,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xcd,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xce,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xcf,"ref_fixture_tet2_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 4) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(4 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar6);
      iVar6 = 5 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xd1,"ref_fixture_tet2_grid",(ulong)uVar4,"add tet");
      return uVar4;
    }
  }
  else {
    iVar12 = (int)(2 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (2 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00128fc3;
    iVar12 = 0;
    if (iVar9 + 1U < 3) {
      iVar12 = iVar9;
    }
    if (iVar6 <= iVar12) {
      iVar12 = (1 - iVar6 * iVar9) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00128fc3;
    iVar12 = (int)(3 / (long)iVar9);
    if (iVar6 <= iVar12) {
      iVar12 = (3 - iVar9 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar12) goto LAB_00128fc3;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,5);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar8 = 0xd4;
LAB_001288d7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_tet2_grid",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet2_grid(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 5;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add tet");
  }

  global[0] = 4;
  global[1] = 2;
  global[2] = 1;
  global[3] = 3;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 1.0, 1.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add tet");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}